

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QUnicodeTools::ScriptItem>::emplace_back_impl<QUnicodeTools::ScriptItem>
          (QVLABase<QUnicodeTools::ScriptItem> *this,qsizetype prealloc,void *array,ScriptItem *args
          )

{
  QVLABase<QUnicodeTools::ScriptItem> *this_00;
  QVLABase<QUnicodeTools::ScriptItem> *pQVar1;
  iterator ptr;
  ScriptItem *pSVar2;
  ScriptItem *in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<QUnicodeTools::ScriptItem> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<QUnicodeTools::ScriptItem> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<QUnicodeTools::ScriptItem> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX);
  }
  ptr = end(this_00);
  pSVar2 = q20::construct_at<QUnicodeTools::ScriptItem,QUnicodeTools::ScriptItem,void>(ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return pSVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }